

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O0

void __thiscall duckdb::CatalogSet::CleanupEntry(CatalogSet *this,CatalogEntry *catalog_entry)

{
  bool bVar1;
  CatalogEntry *pCVar2;
  undefined8 *in_RDI;
  CatalogEntry *parent;
  lock_guard<std::mutex> lock;
  lock_guard<std::mutex> write_lock;
  CatalogEntry *in_stack_00000088;
  CatalogEntryMap *in_stack_00000090;
  mutex_type *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  
  DuckCatalog::GetWriteLock((DuckCatalog *)*in_RDI);
  ::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0)
             ,in_stack_ffffffffffffffa8);
  ::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0)
             ,in_stack_ffffffffffffffa8);
  pCVar2 = CatalogEntry::Parent((CatalogEntry *)0x2a9dac);
  CatalogEntryMap::DropEntry(in_stack_00000090,in_stack_00000088);
  if ((pCVar2->deleted & 1U) != 0) {
    bVar1 = CatalogEntry::HasChild((CatalogEntry *)0x2a9de7);
    if (!bVar1) {
      bVar1 = CatalogEntry::HasParent
                        ((CatalogEntry *)
                         CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
      if (!bVar1) {
        CatalogEntryMap::DropEntry(in_stack_00000090,in_stack_00000088);
      }
    }
  }
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2a9e50);
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2a9e5a);
  return;
}

Assistant:

void CatalogSet::CleanupEntry(CatalogEntry &catalog_entry) {
	// destroy the backed up entry: it is no longer required
	lock_guard<mutex> write_lock(catalog.GetWriteLock());
	lock_guard<mutex> lock(catalog_lock);
	auto &parent = catalog_entry.Parent();
	map.DropEntry(catalog_entry);
	if (parent.deleted && !parent.HasChild() && !parent.HasParent()) {
		// The entry's parent is a tombstone and the entry had no child
		// clean up the mapping and the tombstone entry as well
		D_ASSERT(map.GetEntry(parent.name).get() == &parent);
		map.DropEntry(parent);
	}
}